

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payment.cpp
# Opt level: O3

void handlePostJointResponse(json *receivedObject,char *tag)

{
  cbPaymentResult p_Var1;
  long *__nptr;
  int iVar2;
  int *piVar3;
  long lVar4;
  reference this;
  undefined8 uVar5;
  string strId;
  string stringTag;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string_t local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,tag,(allocator<char> *)local_90);
  std::__cxx11::string::substr((ulong)local_90,(ulong)local_70);
  __nptr = local_90[0];
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol((char *)__nptr,(char **)&local_50,10);
  if ((long *)local_50._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    this = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)receivedObject,"response");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_50,this,-1,' ',false,strict);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    p_Var1 = _cbPaymentResult;
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      if (_cbPaymentResult != (cbPaymentResult)0x0) {
        iVar2 = strcmp(local_50._M_dataplus._M_p,"accepted");
        (*p_Var1)((int)lVar4,10 - (uint)(iVar2 == 0),(char *)0x2fb788);
      }
      bufferPayment.isFree = true;
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    return;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void handlePostJointResponse(nlohmann::json receivedObject, const char * tag){
	std::string stringTag = tag;
	std::string strId = stringTag.substr(10);
	int id = stoi(strId);
	const char * response = receivedObject["response"].dump().c_str();
	if (response != nullptr){
		if (strcmp(response, "accepted") == 0){
			if(_cbPaymentResult){
				_cbPaymentResult(id, PAYMENT_ACKNOWLEDGED, bufferPayment.unit);
			}
			bufferPayment.isFree = true;
		} else {
			if (typeid(receivedObject["error"]) == typeid(nlohmann::json)){
				if(_cbPaymentResult){
					_cbPaymentResult(id, PAYMENT_REFUSED, bufferPayment.unit);
				}
				bufferPayment.isFree = true;
			}
		}
	} 
}